

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
llbuild::core::BuildEngine::BuildEngine(BuildEngine *this,BuildEngineDelegate *delegate)

{
  BuildEngineImpl *this_00;
  BuildEngineDelegate *delegate_local;
  BuildEngine *this_local;
  
  this_00 = (BuildEngineImpl *)operator_new(0x368);
  anon_unknown.dwarf_1fd0be::BuildEngineImpl::BuildEngineImpl(this_00,this,delegate);
  this->impl = this_00;
  return;
}

Assistant:

BuildEngine::BuildEngine(BuildEngineDelegate& delegate)
  : impl(new BuildEngineImpl(*this, delegate))
{
}